

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_errors.c
# Opt level: O0

SUNErrCode SUNErrHandler_Create(SUNErrHandlerFn eh_fn,void *eh_data,SUNErrHandler *eh_out)

{
  undefined8 *puVar1;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  SUNErrHandler eh;
  SUNErrCode local_4;
  
  puVar1 = (undefined8 *)malloc(0x18);
  if (puVar1 == (undefined8 *)0x0) {
    local_4 = -0x2704;
  }
  else {
    *puVar1 = 0;
    puVar1[1] = in_RDI;
    puVar1[2] = in_RSI;
    *in_RDX = puVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SUNErrCode SUNErrHandler_Create(SUNErrHandlerFn eh_fn, void* eh_data,
                                SUNErrHandler* eh_out)
{
  SUNErrHandler eh = NULL;

  eh = (SUNErrHandler)malloc(sizeof(struct SUNErrHandler_));
  if (!eh) { return SUN_ERR_MALLOC_FAIL; }

  eh->previous = NULL;
  eh->call     = eh_fn;
  eh->data     = eh_data;

  *eh_out = eh;
  return SUN_SUCCESS;
}